

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::SSBOLayoutCaseInstance::SSBOLayoutCaseInstance
          (SSBOLayoutCaseInstance *this,Context *context,BufferMode bufferMode,
          ShaderInterface *interface,BufferLayout *refLayout,RefDataStorage *initialData,
          RefDataStorage *writeData)

{
  RefDataStorage *initialData_local;
  BufferLayout *refLayout_local;
  ShaderInterface *interface_local;
  BufferMode bufferMode_local;
  Context *context_local;
  SSBOLayoutCaseInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__SSBOLayoutCaseInstance_01669500;
  this->m_bufferMode = bufferMode;
  this->m_interface = interface;
  this->m_refLayout = refLayout;
  this->m_initialData = initialData;
  this->m_writeData = writeData;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::vector(&this->m_uniformBuffers);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  vector(&this->m_uniformAllocs);
  return;
}

Assistant:

SSBOLayoutCaseInstance::SSBOLayoutCaseInstance (Context&					context,
												SSBOLayoutCase::BufferMode	bufferMode,
												const ShaderInterface&		interface,
												const BufferLayout&			refLayout,
												const RefDataStorage&		initialData,
												const RefDataStorage&		writeData)
	: TestInstance	(context)
	, m_bufferMode	(bufferMode)
	, m_interface	(interface)
	, m_refLayout	(refLayout)
	, m_initialData	(initialData)
	, m_writeData	(writeData)
{
}